

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setInternalState
          (AttitudeQuaternionEKF *this,Span<double,__1L> *stateBuffer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer peVar3;
  long lVar4;
  AttitudeEstimatorState *pAVar5;
  AttitudeEstimatorState *pAVar6;
  byte bVar7;
  Span<double,__1L> x0_span;
  Span<double,__1L> local_28;
  
  bVar7 = 0;
  lVar4 = (stateBuffer->storage_).super_extent_type<_1L>.size_;
  iVar2 = (*(this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator[8])();
  if (lVar4 == CONCAT44(extraout_var,iVar2)) {
    peVar3 = (stateBuffer->storage_).data_;
    (this->m_state_qekf).m_orientation.m_data[0] = *peVar3;
    (this->m_state_qekf).m_orientation.m_data[1] = peVar3[1];
    (this->m_state_qekf).m_orientation.m_data[2] = peVar3[2];
    (this->m_state_qekf).m_orientation.m_data[3] = peVar3[3];
    (this->m_state_qekf).m_angular_velocity.m_data[0] = peVar3[4];
    (this->m_state_qekf).m_angular_velocity.m_data[1] = peVar3[5];
    (this->m_state_qekf).m_angular_velocity.m_data[2] = peVar3[6];
    (this->m_state_qekf).m_gyroscope_bias.m_data[0] = peVar3[7];
    (this->m_state_qekf).m_gyroscope_bias.m_data[1] = peVar3[8];
    (this->m_state_qekf).m_gyroscope_bias.m_data[2] = peVar3[9];
    pAVar5 = &this->m_state_qekf;
    pAVar6 = &this->m_initial_state_qekf;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pAVar6->m_orientation).m_data[0] = (pAVar5->m_orientation).m_data[0];
      pAVar5 = (AttitudeEstimatorState *)((long)pAVar5 + (ulong)bVar7 * -0x10 + 8);
      pAVar6 = (AttitudeEstimatorState *)((long)pAVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    serializeStateVector(this);
    peVar3 = (pointer)iDynTree::VectorDynSize::data();
    local_28.storage_.super_extent_type<_1L>.size_ = iDynTree::VectorDynSize::size();
    local_28.storage_.data_ = peVar3;
    bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetInitialState
                      (&this->super_DiscreteExtendedKalmanFilterHelper,&local_28);
  }
  else {
    iDynTree::reportError
              ("AttitudeQuaternionEKF","setInternalState","state size mismatch, using default state"
              );
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setInternalState(const iDynTree::Span< double >& stateBuffer)
{
    if ((size_t)stateBuffer.size() != getInternalStateSize())
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "setInternalState", "state size mismatch, using default state");
        return false;
    }
    m_state_qekf.m_orientation(0) = stateBuffer(0);
    m_state_qekf.m_orientation(1) = stateBuffer(1);
    m_state_qekf.m_orientation(2) = stateBuffer(2);
    m_state_qekf.m_orientation(3) = stateBuffer(3);
    m_state_qekf.m_angular_velocity(0) = stateBuffer(4);
    m_state_qekf.m_angular_velocity(1) = stateBuffer(5);
    m_state_qekf.m_angular_velocity(2) = stateBuffer(6);
    m_state_qekf.m_gyroscope_bias(0) = stateBuffer(7);
    m_state_qekf.m_gyroscope_bias(1) = stateBuffer(8);
    m_state_qekf.m_gyroscope_bias(2) = stateBuffer(9);

    m_initial_state_qekf = m_state_qekf;
    serializeStateVector();
    iDynTree::Span<double> x0_span(m_x.data(), m_x.size());
    bool ok = ekfSetInitialState(x0_span);
    return ok;
}